

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O1

bool __thiscall cmBinUtilsLinuxELFLinker::Prepare(cmBinUtilsLinuxELFLinker *this)

{
  pointer pcVar1;
  cmBinUtilsLinuxELFGetRuntimeDependenciesTool *pcVar2;
  cmLDConfigTool *pcVar3;
  int iVar4;
  string *psVar5;
  cmBinUtilsLinuxELFGetRuntimeDependenciesTool *this_00;
  cmMakefile *this_01;
  cmLDConfigTool *this_02;
  bool bVar6;
  string ldConfigTool;
  string tool;
  ostringstream e;
  string local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  psVar5 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + psVar5->_M_string_length);
  if (local_1e0 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,0x7ab88e);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar4 == 0) {
    this_00 = (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)operator_new(0x10);
    cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool::
    cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool
              ((cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool *)this_00,
               (this->super_cmBinUtilsLinker).Archive);
    pcVar2 = (this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_false>.
             _M_head_impl;
    (this->Tool)._M_t.
    super___uniq_ptr_impl<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
    .super__Head_base<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_false>._M_head_impl =
         this_00;
    if (pcVar2 != (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)0x0) {
      (*pcVar2->_vptr_cmBinUtilsLinuxELFGetRuntimeDependenciesTool[1])();
    }
    this_01 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_LDCONFIG_TOOL","");
    psVar5 = cmMakefile::GetSafeDefinition(this_01,(string *)local_1a8);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,pcVar1,pcVar1 + psVar5->_M_string_length);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (local_208._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)0x0,0x7b17da);
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_208);
    bVar6 = iVar4 == 0;
    if (bVar6) {
      this_02 = (cmLDConfigTool *)operator_new(0x10);
      cmLDConfigLDConfigTool::cmLDConfigLDConfigTool
                ((cmLDConfigLDConfigTool *)this_02,(this->super_cmBinUtilsLinker).Archive);
      pcVar3 = (this->LDConfigTool)._M_t.
               super___uniq_ptr_impl<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>._M_t.
               super__Tuple_impl<0UL,_cmLDConfigTool_*,_std::default_delete<cmLDConfigTool>_>.
               super__Head_base<0UL,_cmLDConfigTool_*,_false>._M_head_impl;
      (this->LDConfigTool)._M_t.
      super___uniq_ptr_impl<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>._M_t.
      super__Tuple_impl<0UL,_cmLDConfigTool_*,_std::default_delete<cmLDConfigTool>_>.
      super__Head_base<0UL,_cmLDConfigTool_*,_false>._M_head_impl = this_02;
      if (pcVar3 != (cmLDConfigTool *)0x0) {
        (*pcVar3->_vptr_cmLDConfigTool[1])();
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Invalid value for CMAKE_LDCONFIG_TOOL: ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::__cxx11::stringbuf::str();
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ",0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_1e8,local_1e0);
    std::__cxx11::stringbuf::str();
    cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar6 = false;
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  return bVar6;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    tool = "objdump";
  }
  if (tool == "objdump") {
    this->Tool =
      cm::make_unique<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  std::string ldConfigTool =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_TOOL");
  if (ldConfigTool.empty()) {
    ldConfigTool = "ldconfig";
  }
  if (ldConfigTool == "ldconfig") {
    this->LDConfigTool =
      cm::make_unique<cmLDConfigLDConfigTool>(this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_LDCONFIG_TOOL: " << ldConfigTool;
    this->SetError(e.str());
    return false;
  }

  return true;
}